

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared_string.cpp
# Opt level: O2

bool ublib::operator<=(Shared_string *lhs,Shared_string *rhs)

{
  element_type *peVar1;
  element_type *peVar2;
  bool bVar3;
  element_type *peVar4;
  element_type *peVar5;
  basic_string_view<char,_std::char_traits<char>_> __x;
  basic_string_view<char,_std::char_traits<char>_> __y;
  
  peVar1 = (element_type *)lhs->length_;
  peVar4 = peVar1;
  if (peVar1 != (element_type *)0x0) {
    peVar4 = (lhs->underlying_).super___shared_ptr<const_char[],_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  }
  peVar2 = (element_type *)rhs->length_;
  peVar5 = peVar2;
  if (peVar2 != (element_type *)0x0) {
    peVar5 = (rhs->underlying_).super___shared_ptr<const_char[],_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  }
  __x._M_str = peVar4;
  __x._M_len = (size_t)peVar1;
  __y._M_str = peVar5;
  __y._M_len = (size_t)peVar2;
  bVar3 = std::operator<=(__x,__y);
  return bVar3;
}

Assistant:

bool operator<=(Shared_string const& lhs, Shared_string const& rhs) noexcept {
  return std::string_view(lhs) <= std::string_view(rhs);
}